

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

bool __thiscall World::PlayerOnline(World *this,string *username)

{
  pointer pcVar1;
  EOServer *pEVar2;
  _List_node_base *p_Var3;
  bool bVar4;
  int iVar5;
  _List_node_base *p_Var6;
  string local_48;
  
  pcVar1 = (username->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + username->_M_string_length);
  bVar4 = Player::ValidName(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    pEVar2 = this->server;
    for (p_Var6 = (pEVar2->super_Server).clients.
                  super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                  super__List_node_base._M_next;
        p_Var6 != (_List_node_base *)&(pEVar2->super_Server).clients; p_Var6 = p_Var6->_M_next) {
      p_Var3 = *(_List_node_base **)((long)(p_Var6[1]._M_next + 0x10) + 8);
      if ((p_Var3 != (_List_node_base *)0x0) &&
         (iVar5 = std::__cxx11::string::compare((string *)(p_Var3 + 1)), iVar5 == 0)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool World::PlayerOnline(std::string username)
{
	if (!Player::ValidName(username))
	{
		return false;
	}

	UTIL_FOREACH(this->server->clients, client)
	{
		EOClient *eoclient = static_cast<EOClient *>(client);

		if (eoclient->player)
		{
			if (eoclient->player->username.compare(username) == 0)
			{
				return true;
			}
		}
	}

	return false;
}